

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O2

FState * __thiscall
FStateLabelStorage::GetState(FStateLabelStorage *this,int pos,PClassActor *cls,bool exact)

{
  FName *names;
  FState *pFVar1;
  FState *pFVar2;
  FName local_4;
  
  if (pos < 0x10000001) {
    if (pos < 0) {
      pFVar1 = *(FState **)((this->Storage).Array + ((ulong)(uint)pos & 0xffff) * 4);
      while( true ) {
        if (cls == (PClassActor *)AActor::RegistrationInfo.MyClass) {
          return (FState *)0x0;
        }
        if ((cls->OwnedStates <= pFVar1) &&
           (pFVar2 = cls->OwnedStates + cls->NumOwnedStates, pFVar1 < pFVar2)) break;
        cls = (PClassActor *)(cls->super_PClass).ParentClass;
      }
      if (pFVar2 <= pFVar1 + ((uint)pos >> 0x10 & 0x7fff)) {
        return (FState *)0x0;
      }
      return pFVar1 + ((uint)pos >> 0x10 & 0x7fff);
    }
    if (pos != 0) {
      names = (FName *)((this->Storage).Array + (ulong)(uint)pos * 4);
      if (names[-1].Index == 0) {
        return *(FState **)names;
      }
      if (cls != (PClassActor *)0x0) {
        pFVar1 = PClassActor::FindState(cls,names[-1].Index,names,exact);
        return pFVar1;
      }
    }
  }
  else if (cls != (PClassActor *)0x0) {
    pFVar1 = PClassActor::FindState(cls,&local_4);
    return pFVar1;
  }
  return (FState *)0x0;
}

Assistant:

FState *FStateLabelStorage::GetState(int pos, PClassActor *cls, bool exact)
{
	if (pos > 0x10000000)
	{
		return cls? cls->FindState(ENamedName(pos - 0x10000000)) : nullptr;
	}
	else if (pos < 0)
	{
		// decode the combined value produced by the script.
		int index = (pos >> 16) & 32767;
		pos = ((pos & 65535) - 1) * 4;
		FState *state;
		memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
		if (VerifyJumpTarget(cls, state, index))
			return state + index;
		else
			return nullptr;
	}
	else if (pos > 0)
	{
		int val;
		pos = (pos - 1) * 4;
		memcpy(&val, &Storage[pos], sizeof(int));

		if (val == 0)
		{
			FState *state;
			memcpy(&state, &Storage[pos + sizeof(int)], sizeof(state));
			return state;
		}
		else if (cls != nullptr)
		{
			FName *labels = (FName*)&Storage[pos + sizeof(int)];
			return cls->FindState(val, labels, exact);
		}
	}
	return nullptr;
}